

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_charcode.hpp
# Opt level: O0

string * __thiscall
iutest::detail::AnyStringToMultiByteString_abi_cxx11_
          (string *__return_storage_ptr__,detail *this,char *str,int num)

{
  ulong uVar1;
  allocator local_2d [15];
  byte local_1e;
  allocator<char> local_1d;
  int local_1c;
  detail *pdStack_18;
  int num_local;
  char *str_local;
  
  local_1c = (int)str;
  local_1e = 0;
  pdStack_18 = this;
  str_local = (char *)__return_storage_ptr__;
  if (local_1c < 0) {
    std::allocator<char>::allocator();
    local_1e = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,(char *)this,&local_1d);
  }
  else {
    uVar1 = (ulong)local_1c;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)this,uVar1,local_2d);
    std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  if ((local_1e & 1) != 0) {
    std::allocator<char>::~allocator(&local_1d);
  }
  return __return_storage_ptr__;
}

Assistant:

inline ::std::string AnyStringToMultiByteString(const char* str, int num = -1)
{
    return num < 0 ? str : ::std::string(str, static_cast<size_t>(num));
}